

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler3>
::
ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler3>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler3>
           *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                    (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
  if (*(int *)(*(long *)(this + 8) + 4) < iVar1) {
    BinaryReaderBase::ReportError<>(*(BinaryReaderBase **)this,(CStringRef)0x2178ae);
  }
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>::
    ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>
              *)this,*(uint *)(*(long *)(this + 8) + 4));
    BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
              (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}